

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::GetSongInfo(GYMPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  size_type sVar2;
  UINT32 local_2c;
  PLR_SONG_INFO *songInf_local;
  GYMPlayer *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    songInf->format = 0x47594d00;
    songInf->fileVerMaj = 0;
    songInf->fileVerMin = 0;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = this->_tickFreq;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if (this->_loopOfs == 0) {
      local_2c = 0xffffffff;
    }
    else {
      local_2c = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])();
    }
    songInf->loopTick = local_2c;
    songInf->volGain = 0x10000;
    sVar2 = std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::size
                      (&this->_devCfgs);
    songInf->deviceCnt = (UINT32)sVar2;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 GYMPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_GYM;
	songInf.fileVerMaj = 0;
	songInf.fileVerMin = 0;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = _tickFreq;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devCfgs.size();
	
	return 0x00;
}